

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O0

LinConEQ * __thiscall
mp::LinearFunctionalConstraint::to_linear_constraint(LinearFunctionalConstraint *this)

{
  LinearFunctionalConstraint *in_RSI;
  LinConEQ *in_RDI;
  double dVar1;
  LinTerms le;
  AffineExpr *ae;
  LinTerms *in_stack_fffffffffffffeb8;
  LinConEQ *c;
  undefined1 fSort;
  AlgConRhs<0> in_stack_fffffffffffffee0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffffee8;
  AlgConRhs<0> in_stack_fffffffffffffef0;
  undefined1 local_90 [120];
  AffineExpr *local_18;
  
  c = in_RDI;
  local_18 = GetAffineExpr(in_RSI);
  LinTerms::GetLinTerms(&local_18->super_LinTerms);
  fSort = (undefined1)((ulong)local_90 >> 0x38);
  LinTerms::LinTerms((LinTerms *)in_RSI,(LinTerms *)c);
  FunctionalConstraint::GetResultVar(&in_RSI->super_FunctionalConstraint);
  LinTerms::add_term((LinTerms *)in_RSI,(double)c,(int)((ulong)in_RDI >> 0x20));
  LinTerms::LinTerms((LinTerms *)in_RDI,in_stack_fffffffffffffeb8);
  dVar1 = AlgebraicExpression<mp::LinTerms>::constant_term(local_18);
  AlgConRhs<0>::AlgConRhs((AlgConRhs<0> *)&stack0xfffffffffffffee0,-dVar1);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (in_stack_fffffffffffffee8,(LinTerms *)in_stack_fffffffffffffee0.rhs_,
             in_stack_fffffffffffffef0,(bool)fSort);
  LinTerms::~LinTerms((LinTerms *)in_RDI);
  LinTerms::~LinTerms((LinTerms *)in_RDI);
  return c;
}

Assistant:

LinConEQ to_linear_constraint() const {
    const auto& ae = GetAffineExpr();
    auto le = ae.GetLinTerms();
    le.add_term(-1.0, FunctionalConstraint::GetResultVar());
    return { std::move(le), -ae.constant_term() };
  }